

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::DynamicMapField::SyncMapWithRepeatedFieldNoLock(DynamicMapField *this)

{
  bool bVar1;
  _Alloc_hider _Var2;
  CppType CVar3;
  int32_t iVar4;
  uint32_t uVar5;
  int iVar6;
  Reflection *this_00;
  Descriptor *pDVar7;
  FieldDescriptor *this_01;
  reference pMVar8;
  int64_t iVar9;
  uint64_t value_00;
  LogMessage *other;
  pointer pvVar10;
  MapValueConstRef *this_02;
  int *val;
  Message *pMVar11;
  undefined4 extraout_var;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this_03;
  float fVar12;
  double dVar13;
  Message *value_9;
  Message *message;
  int32_t *value_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  string *value_7;
  bool *value_6;
  float *value_5;
  double *value_4;
  uint64_t *value_3;
  uint32_t *value_2;
  int64_t *value_1;
  int32_t *value;
  MapValueRef *map_val;
  undefined1 local_120 [8];
  iterator iter_1;
  LogMessage local_100;
  string local_c8;
  undefined1 local_98 [8];
  MapKey map_key;
  RepeatedPtrIterator<google::protobuf::Message> local_68;
  iterator it;
  undefined1 local_48 [8];
  iterator iter;
  FieldDescriptor *val_des;
  FieldDescriptor *key_des;
  Reflection *reflection;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *map;
  DynamicMapField *this_local;
  long *val_00;
  
  this_03 = &this->map_;
  this_00 = Message::GetReflection(this->default_entry_);
  pDVar7 = Message::GetDescriptor(this->default_entry_);
  this_01 = Descriptor::map_key(pDVar7);
  pDVar7 = Message::GetDescriptor(this->default_entry_);
  iter.it_.bucket_index_ = (size_type)Descriptor::map_value(pDVar7);
  if ((this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
      .super_MapFieldBase.arena_ == (Arena *)0x0) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
              ((iterator *)local_48,this_03);
    while( true ) {
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end((iterator *)&it,this_03);
      bVar1 = protobuf::operator!=((iterator *)local_48,(iterator *)&it);
      if (!bVar1) break;
      pvVar10 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator->
                          ((iterator *)local_48);
      MapValueRef::DeleteData((MapValueRef *)(pvVar10 + 0x28));
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator++
                ((iterator *)local_48);
    }
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear(this_03);
  local_68.it_ = (void **)RepeatedPtrField<google::protobuf::Message>::begin
                                    ((this->
                                     super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                     ).super_MapFieldBase.repeated_field_);
  while( true ) {
    map_key._32_8_ =
         RepeatedPtrField<google::protobuf::Message>::end
                   ((this->
                    super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                    ).super_MapFieldBase.repeated_field_);
    bVar1 = RepeatedPtrIterator<google::protobuf::Message>::operator!=
                      (&local_68,(iterator *)&map_key.type_);
    if (!bVar1) break;
    MapKey::MapKey((MapKey *)local_98);
    CVar3 = FieldDescriptor::cpp_type(this_01);
    switch(CVar3) {
    case CPPTYPE_INT32:
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_68);
      iVar4 = Reflection::GetInt32(this_00,pMVar8,this_01);
      MapKey::SetInt32Value((MapKey *)local_98,iVar4);
      break;
    case CPPTYPE_INT64:
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_68);
      iVar9 = Reflection::GetInt64(this_00,pMVar8,this_01);
      MapKey::SetInt64Value((MapKey *)local_98,iVar9);
      break;
    case CPPTYPE_UINT32:
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_68);
      uVar5 = Reflection::GetUInt32(this_00,pMVar8,this_01);
      MapKey::SetUInt32Value((MapKey *)local_98,uVar5);
      break;
    case CPPTYPE_UINT64:
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_68);
      value_00 = Reflection::GetUInt64(this_00,pMVar8,this_01);
      MapKey::SetUInt64Value((MapKey *)local_98,value_00);
      break;
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
    case CPPTYPE_MESSAGE:
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
                 ,0x22b);
      other = LogMessage::operator<<(&local_100,"Can\'t get here.");
      LogFinisher::operator=((LogFinisher *)((long)&iter_1.it_.bucket_index_ + 7),other);
      LogMessage::~LogMessage(&local_100);
      break;
    case CPPTYPE_BOOL:
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_68);
      bVar1 = Reflection::GetBool(this_00,pMVar8,this_01);
      MapKey::SetBoolValue((MapKey *)local_98,bVar1);
      break;
    case CPPTYPE_STRING:
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_68);
      Reflection::GetString_abi_cxx11_(&local_c8,this_00,pMVar8,this_01);
      MapKey::SetStringValue((MapKey *)local_98,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    if ((this->
        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
        super_MapFieldBase.arena_ == (Arena *)0x0) {
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find<google::protobuf::MapKey>
                ((iterator *)local_120,this_03,(key_arg<google::protobuf::MapKey> *)local_98);
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end
                ((iterator *)&map_val,this_03);
      bVar1 = protobuf::operator!=((iterator *)local_120,(iterator *)&map_val);
      if (bVar1) {
        pvVar10 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator->
                            ((iterator *)local_120);
        MapValueRef::DeleteData((MapValueRef *)(pvVar10 + 0x28));
      }
    }
    this_02 = &Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
               operator[]<google::protobuf::MapKey>
                         (this_03,(key_arg<google::protobuf::MapKey> *)local_98)->
               super_MapValueConstRef;
    value = (int32_t *)this_02;
    CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)iter.it_.bucket_index_);
    MapValueConstRef::SetType(this_02,CVar3);
    CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)iter.it_.bucket_index_);
    switch(CVar3) {
    case CPPTYPE_INT32:
      value_1 = (int64_t *)
                Arena::Create<int>((this->
                                   super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                   ).super_MapFieldBase.arena_);
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_68);
      iVar4 = Reflection::GetInt32(this_00,pMVar8,(FieldDescriptor *)iter.it_.bucket_index_);
      *(int32_t *)value_1 = iVar4;
      MapValueConstRef::SetValue((MapValueConstRef *)value,value_1);
      break;
    case CPPTYPE_INT64:
      value_2 = (uint32_t *)
                Arena::Create<long>((this->
                                    super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                    ).super_MapFieldBase.arena_);
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_68);
      iVar9 = Reflection::GetInt64(this_00,pMVar8,(FieldDescriptor *)iter.it_.bucket_index_);
      *(int64_t *)value_2 = iVar9;
      MapValueConstRef::SetValue((MapValueConstRef *)value,value_2);
      break;
    case CPPTYPE_UINT32:
      value_3 = (uint64_t *)
                Arena::Create<unsigned_int>
                          ((this->
                           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                           ).super_MapFieldBase.arena_);
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_68);
      uVar5 = Reflection::GetUInt32(this_00,pMVar8,(FieldDescriptor *)iter.it_.bucket_index_);
      *(uint32_t *)value_3 = uVar5;
      MapValueConstRef::SetValue((MapValueConstRef *)value,value_3);
      break;
    case CPPTYPE_UINT64:
      value_4 = (double *)
                Arena::Create<unsigned_long>
                          ((this->
                           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                           ).super_MapFieldBase.arena_);
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_68);
      dVar13 = (double)Reflection::GetUInt64
                                 (this_00,pMVar8,(FieldDescriptor *)iter.it_.bucket_index_);
      *value_4 = dVar13;
      MapValueConstRef::SetValue((MapValueConstRef *)value,value_4);
      break;
    case CPPTYPE_DOUBLE:
      value_5 = (float *)Arena::Create<double>
                                   ((this->
                                    super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                    ).super_MapFieldBase.arena_);
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_68);
      dVar13 = Reflection::GetDouble(this_00,pMVar8,(FieldDescriptor *)iter.it_.bucket_index_);
      *(double *)value_5 = dVar13;
      MapValueConstRef::SetValue((MapValueConstRef *)value,value_5);
      break;
    case CPPTYPE_FLOAT:
      value_6 = (bool *)Arena::Create<float>
                                  ((this->
                                   super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                   ).super_MapFieldBase.arena_);
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_68);
      fVar12 = Reflection::GetFloat(this_00,pMVar8,(FieldDescriptor *)iter.it_.bucket_index_);
      *(float *)value_6 = fVar12;
      MapValueConstRef::SetValue((MapValueConstRef *)value,value_6);
      break;
    case CPPTYPE_BOOL:
      value_7 = (string *)
                Arena::Create<bool>((this->
                                    super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                    ).super_MapFieldBase.arena_);
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_68);
      _Var2 = (_Alloc_hider)
              Reflection::GetBool(this_00,pMVar8,(FieldDescriptor *)iter.it_.bucket_index_);
      value_7->_M_dataplus = _Var2;
      MapValueConstRef::SetValue((MapValueConstRef *)value,value_7);
      break;
    case CPPTYPE_ENUM:
      val = Arena::Create<int>((this->
                               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                               ).super_MapFieldBase.arena_);
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_68);
      iVar6 = Reflection::GetEnumValue(this_00,pMVar8,(FieldDescriptor *)iter.it_.bucket_index_);
      *val = iVar6;
      MapValueConstRef::SetValue((MapValueConstRef *)value,val);
      break;
    case CPPTYPE_STRING:
      local_180 = Arena::Create<std::__cxx11::string>
                            ((this->
                             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                             ).super_MapFieldBase.arena_);
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_68);
      Reflection::GetString_abi_cxx11_
                ((string *)&value_8,this_00,pMVar8,(FieldDescriptor *)iter.it_.bucket_index_);
      std::__cxx11::string::operator=((string *)local_180,(string *)&value_8);
      std::__cxx11::string::~string((string *)&value_8);
      MapValueConstRef::SetValue((MapValueConstRef *)value,local_180);
      break;
    case CPPTYPE_MESSAGE:
      pMVar8 = RepeatedPtrIterator<google::protobuf::Message>::operator*(&local_68);
      pMVar11 = Reflection::GetMessage
                          (this_00,pMVar8,(FieldDescriptor *)iter.it_.bucket_index_,
                           (MessageFactory *)0x0);
      iVar6 = (*(pMVar11->super_MessageLite)._vptr_MessageLite[3])
                        (pMVar11,(this->
                                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                 ).super_MapFieldBase.arena_);
      val_00 = (long *)CONCAT44(extraout_var,iVar6);
      (**(code **)(*val_00 + 0x68))(val_00,pMVar11);
      MapValueConstRef::SetValue((MapValueConstRef *)value,val_00);
    }
    MapKey::~MapKey((MapKey *)local_98);
    RepeatedPtrIterator<google::protobuf::Message>::operator++(&local_68);
  }
  return;
}

Assistant:

void DynamicMapField::SyncMapWithRepeatedFieldNoLock() const {
  Map<MapKey, MapValueRef>* map = &const_cast<DynamicMapField*>(this)->map_;
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des = default_entry_->GetDescriptor()->map_key();
  const FieldDescriptor* val_des = default_entry_->GetDescriptor()->map_value();
  // DynamicMapField owns map values. Need to delete them before clearing
  // the map.
  if (MapFieldBase::arena_ == nullptr) {
    for (Map<MapKey, MapValueRef>::iterator iter = map->begin();
         iter != map->end(); ++iter) {
      iter->second.DeleteData();
    }
  }
  map->clear();
  for (RepeatedPtrField<Message>::iterator it =
           MapFieldBase::repeated_field_->begin();
       it != MapFieldBase::repeated_field_->end(); ++it) {
    // MapKey type will be set later.
    MapKey map_key;
    switch (key_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        map_key.SetStringValue(reflection->GetString(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        map_key.SetInt64Value(reflection->GetInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        map_key.SetInt32Value(reflection->GetInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        map_key.SetUInt64Value(reflection->GetUInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        map_key.SetUInt32Value(reflection->GetUInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        map_key.SetBoolValue(reflection->GetBool(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }

    if (MapFieldBase::arena_ == nullptr) {
      // Remove existing map value with same key.
      Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
      if (iter != map->end()) {
        iter->second.DeleteData();
      }
    }

    MapValueRef& map_val = (*map)[map_key];
    map_val.SetType(val_des->cpp_type());
    switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE, METHOD)                   \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: {                 \
    TYPE* value = Arena::Create<TYPE>(MapFieldBase::arena_); \
    *value = reflection->Get##METHOD(*it, val_des);          \
    map_val.SetValue(value);                                 \
    break;                                                   \
  }
      HANDLE_TYPE(INT32, int32_t, Int32);
      HANDLE_TYPE(INT64, int64_t, Int64);
      HANDLE_TYPE(UINT32, uint32_t, UInt32);
      HANDLE_TYPE(UINT64, uint64_t, UInt64);
      HANDLE_TYPE(DOUBLE, double, Double);
      HANDLE_TYPE(FLOAT, float, Float);
      HANDLE_TYPE(BOOL, bool, Bool);
      HANDLE_TYPE(STRING, std::string, String);
      HANDLE_TYPE(ENUM, int32_t, EnumValue);
#undef HANDLE_TYPE
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = reflection->GetMessage(*it, val_des);
        Message* value = message.New(MapFieldBase::arena_);
        value->CopyFrom(message);
        map_val.SetValue(value);
        break;
      }
    }
  }
}